

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::process_and_close_socket(Server *this,socket_t sock)

{
  bool bVar1;
  time_t in_stack_00000020;
  undefined4 in_stack_00000028;
  bool ret;
  size_t in_stack_00000038;
  socket_t in_stack_00000044;
  atomic<int> *in_stack_00000048;
  anon_class_8_1_8991fb9c in_stack_00000050;
  time_t in_stack_00000060;
  time_t in_stack_00000068;
  
  bVar1 = detail::
          process_server_socket<httplib::Server::process_and_close_socket(int)::_lambda(httplib::Stream&,bool,bool&)_1_>
                    (in_stack_00000048,in_stack_00000044,in_stack_00000038,(time_t)this,
                     CONCAT44(sock,in_stack_00000028),in_stack_00000020,in_stack_00000060,
                     in_stack_00000068,in_stack_00000050);
  detail::shutdown_socket(0);
  detail::close_socket(0);
  return bVar1;
}

Assistant:

inline bool Server::process_and_close_socket(socket_t sock) {
  auto ret = detail::process_server_socket(
      svr_sock_, sock, keep_alive_max_count_, keep_alive_timeout_sec_,
      read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_,
      [this](Stream &strm, bool close_connection, bool &connection_closed) {
        return process_request(strm, close_connection, connection_closed,
                               nullptr);
      });

  detail::shutdown_socket(sock);
  detail::close_socket(sock);
  return ret;
}